

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O2

unsigned_long elf_numsegments(GlobalVars *gv)

{
  uint uVar1;
  int iVar2;
  Phdr *pPVar3;
  
  pPVar3 = (Phdr *)&gv->phdrlist;
  iVar2 = 0;
  while (pPVar3 = pPVar3->next, pPVar3 != (Phdr *)0x0) {
    uVar1._0_2_ = pPVar3->flags;
    uVar1._2_1_ = pPVar3->alignment;
    uVar1._3_1_ = pPVar3->reserved;
    iVar2 = iVar2 + (uint)((uVar1 >> 4 & 1) != 0);
  }
  return (long)iVar2;
}

Assistant:

unsigned long elf_numsegments(struct GlobalVars *gv)
{
  int segcnt = 0;
  struct Phdr *p = gv->phdrlist;

  while (p) {
    if (p->flags & PHDR_USED)
      segcnt++;
    p = p->next;
  }
  return segcnt;
}